

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
::
Insert<(JsUtil::SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
          (SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
  *pSVar1;
  uint uVar2;
  TBKey pRVar3;
  long lVar4;
  code *pcVar5;
  uint uVar6;
  undefined4 *puVar7;
  int i;
  ulong uVar8;
  uint key_00;
  int unaff_R13D;
  long lVar9;
  int last;
  long lVar10;
  bool bVar11;
  ulong local_48;
  hash_t local_3c;
  
  lVar10 = *(long *)(this + 8);
  if (lVar10 == 0) {
    SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::Initialize((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this,0);
    lVar10 = *(long *)(this + 8);
  }
  key_00 = (uint)((ulong)*key >> 4) & 0x7fffffff;
  local_3c = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
  local_48 = (ulong)local_3c;
  uVar2 = *(uint *)(lVar10 + local_48 * 4);
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 0) {
    bVar11 = true;
    local_48._0_4_ = unaff_R13D;
  }
  else {
    lVar10 = *(long *)(this + 0x10);
    last = -1;
    do {
      i = (int)uVar8;
      pRVar3 = *(TBKey *)(*(long *)(this + 0x18) + uVar8 * 0x10);
      if (pRVar3 == (TBKey)0x0) {
        uVar2 = *(uint *)(*(long *)(this + 0x10) + 4 + uVar8 * 8);
        SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    *)this,i,last,local_3c);
        uVar6 = 3;
        uVar8 = (ulong)uVar2;
      }
      else if (pRVar3 == *key) {
        *(TBValue *)(*(long *)(this + 0x10) + (long)i * 8) = *value;
        uVar6 = 1;
        local_48 = uVar8;
      }
      else {
        uVar8 = (ulong)*(uint *)(lVar10 + 4 + (long)i * 8);
        uVar6 = 0;
        last = i;
      }
      if ((uVar6 != 3) && (uVar6 != 0)) goto LAB_00d38160;
    } while (-1 < (int)uVar8);
    uVar6 = 0;
LAB_00d38160:
    bVar11 = (uVar6 & 1) == 0;
  }
  if (bVar11) {
    if ((*(int *)(this + 0x38) == 0) && (*(int *)(this + 0x30) == *(int *)(this + 0x28))) {
      (*(code *)**(undefined8 **)this)(this);
    }
    if (*(int *)(this + 0x38) == 0) {
      local_48._0_4_ = *(int *)(this + 0x30);
      if ((int)local_48 == *(int *)(this + 0x28)) {
        SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        ::Resize((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this);
        local_3c = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
        local_48._0_4_ = *(int *)(this + 0x30);
      }
      *(int *)(this + 0x30) = (int)local_48 + 1;
      if (*(int *)(this + 0x28) < (int)local_48 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                            ,0x2ba,"(count <= size)","count <= size");
        if (!bVar11) goto LAB_00d38474;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x28) <= (int)local_48) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                            ,699,"(index < size)","index < size");
        if (!bVar11) goto LAB_00d38474;
        *puVar7 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x38) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                            ,0x29d,"(freeCount > 0)","freeCount > 0");
        if (!bVar11) goto LAB_00d38474;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x34) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                            ,0x29e,"(freeList >= 0)","freeList >= 0");
        if (!bVar11) goto LAB_00d38474;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x30) <= *(int *)(this + 0x34)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                            ,0x29f,"(freeList < count)","freeList < count");
        if (!bVar11) goto LAB_00d38474;
        *puVar7 = 0;
      }
      local_48._0_4_ = *(int *)(this + 0x34);
      pSVar1 = this + 0x38;
      *(int *)pSVar1 = *(int *)pSVar1 + -1;
      if (*(int *)pSVar1 != 0) {
        lVar10 = *(long *)(this + 0x10);
        if (-2 < *(int *)(lVar10 + 4 + (long)(int)local_48 * 8)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                              ,0x1a9,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
          if (!bVar11) {
LAB_00d38474:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar7 = 0;
        }
        *(int *)(this + 0x34) = -2 - *(int *)(lVar10 + 4 + (long)(int)local_48 * 8);
      }
    }
    lVar9 = (long)(int)local_48;
    Memory::RecyclerWeakReferenceRegionItem<Js::RecyclableObject_*>::operator=
              ((RecyclerWeakReferenceRegionItem<Js::RecyclableObject_*> *)
               (lVar9 * 0x10 + *(long *)(this + 0x18)),*key);
    lVar10 = *(long *)(this + 0x10);
    *(TBValue *)(lVar10 + lVar9 * 8) = *value;
    lVar4 = *(long *)(this + 8);
    *(undefined4 *)(lVar10 + 4 + lVar9 * 8) = *(undefined4 *)(lVar4 + (ulong)local_3c * 4);
    *(int *)(lVar4 + (ulong)local_3c * 4) = (int)local_48;
  }
  return (int)local_48;
}

Assistant:

int Insert(const TBKey& key, const TBValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCodeWithKey<TBKey>(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }

                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            SetValue(value, i);
                            return i;
                        }
                        return -1;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (freeCount == 0 && count == size)
            {
                this->Cleanup();
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if (freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            SetKeyValue(key, value, index);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

            return index;
        }